

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O0

int run_test_getaddrinfo_fail_sync(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 local_a8 [8];
  uv_getaddrinfo_t req;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar2,local_a8,0,"xyzzy.xyzzy.xyzzy.",0);
  if (-1 < iVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
            ,0x75,
            "0 > uv_getaddrinfo(uv_default_loop(), &req, NULL, \"xyzzy.xyzzy.xyzzy.\", NULL, NULL)")
    ;
    abort();
  }
  uv_freeaddrinfo(req.service);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
            ,0x78,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(getaddrinfo_fail_sync) {
  uv_getaddrinfo_t req;

  /* Use a FQDN by ending in a period */
  ASSERT(0 > uv_getaddrinfo(uv_default_loop(),
                            &req,
                            NULL,
                            "xyzzy.xyzzy.xyzzy.",
                            NULL,
                            NULL));
  uv_freeaddrinfo(req.addrinfo);

  MAKE_VALGRIND_HAPPY();
  return 0;
}